

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

bcf_hdr_t * vcf_hdr_read(htsFile *fp)

{
  bool bVar1;
  int iVar2;
  BGZF *f_00;
  long lVar3;
  char **__ptr;
  bcf_hrec_t *pbVar4;
  char *pcVar5;
  size_t sVar6;
  bcf_hrec_t *hrec;
  char **names;
  int local_88;
  int need_sync;
  int n;
  int i;
  tbx_t *idx;
  undefined1 auStack_70 [4];
  int c;
  kstring_t tmp;
  kstream_t_conflict *ks;
  gzFile f;
  bcf_hdr_t *pbStack_40;
  int dret;
  bcf_hdr_t *h;
  kstring_t *s;
  kstring_t txt;
  htsFile *fp_local;
  
  h = (bcf_hdr_t *)&fp->line;
  txt.s = (char *)fp;
  pbStack_40 = bcf_hdr_init("r");
  txt.l = 0;
  s = (kstring_t *)0x0;
  txt.m = 0;
  do {
    do {
      iVar2 = hts_getline((htsFile *)txt.s,2,(kstring_t *)h);
      if (iVar2 < 0) goto LAB_0011fd9a;
    } while (*(long *)h->n == 0);
    if (*(char *)&h->id[0]->key != '#') {
      if (1 < hts_verbose) {
        fprintf(_stderr,"[E::%s] no sample line\n","vcf_hdr_read");
      }
      free((void *)txt.m);
      bcf_hdr_destroy(pbStack_40);
      return (bcf_hdr_t *)0x0;
    }
    if ((*(char *)((long)&h->id[0]->key + 1) != '#') && (*(long *)(txt.s + 0x30) != 0)) {
      tmp.l = 0;
      _auStack_70 = 0;
      tmp.m = 0;
      f_00 = (BGZF *)gzopen(*(undefined8 *)(txt.s + 0x30));
      tmp.s = (char *)ks_init(f_00);
      while (iVar2 = ks_getuntil((kstream_t_conflict *)tmp.s,0,(kstring_t *)auStack_70,
                                 (int *)((long)&f + 4)), -1 < iVar2) {
        kputs("##contig=<ID=",(kstring_t *)&s);
        kputs((char *)tmp.m,(kstring_t *)&s);
        ks_getuntil((kstream_t_conflict *)tmp.s,0,(kstring_t *)auStack_70,(int *)((long)&f + 4));
        kputs(",length=",(kstring_t *)&s);
        lVar3 = atol((char *)tmp.m);
        kputw((int)lVar3,(kstring_t *)&s);
        kputsn(">\n",2,(kstring_t *)&s);
        if (f._4_4_ != 10) {
          do {
            idx._4_4_ = ks_getc((kstream_t_conflict *)tmp.s);
          } while (idx._4_4_ != 10 && idx._4_4_ != -1);
        }
      }
      free((void *)tmp.m);
      ks_destroy((kstream_t *)tmp.s);
      gzclose(f_00);
    }
    kputsn((char *)h->id[0],(int)*(undefined8 *)h->n,(kstring_t *)&s);
    kputc(10,(kstring_t *)&s);
  } while (*(char *)((long)&h->id[0]->key + 1) == '#');
LAB_0011fd9a:
  if (txt.m == 0) {
    fprintf(_stderr,"[%s:%d %s] Could not read the header\n",
            "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
            ,0x4db,"vcf_hdr_read");
    fp_local = (htsFile *)0x0;
  }
  else {
    bcf_hdr_parse(pbStack_40,(char *)txt.m);
    _n = tbx_index_load(*(char **)(txt.s + 0x28));
    if (_n != (tbx_t *)0x0) {
      bVar1 = false;
      __ptr = tbx_seqnames(_n,&local_88);
      for (need_sync = 0; need_sync < local_88; need_sync = need_sync + 1) {
        pbVar4 = bcf_hdr_get_hrec(pbStack_40,3,"ID",__ptr[need_sync],(char *)0x0);
        if (pbVar4 == (bcf_hrec_t *)0x0) {
          pbVar4 = (bcf_hrec_t *)calloc(1,0x30);
          pcVar5 = strdup("contig");
          pbVar4->key = pcVar5;
          bcf_hrec_add_key(pbVar4,"ID",2);
          iVar2 = pbVar4->nkeys;
          pcVar5 = __ptr[need_sync];
          sVar6 = strlen(__ptr[need_sync]);
          bcf_hrec_set_val(pbVar4,iVar2 + -1,pcVar5,(int)sVar6,0);
          bcf_hdr_add_hrec(pbStack_40,pbVar4);
          bVar1 = true;
        }
      }
      free(__ptr);
      tbx_destroy(_n);
      if (bVar1) {
        bcf_hdr_sync(pbStack_40);
      }
    }
    free((void *)txt.m);
    fp_local = (htsFile *)pbStack_40;
  }
  return (bcf_hdr_t *)fp_local;
}

Assistant:

bcf_hdr_t *vcf_hdr_read(htsFile *fp)
{
    kstring_t txt, *s = &fp->line;
    bcf_hdr_t *h;
    h = bcf_hdr_init("r");
    txt.l = txt.m = 0; txt.s = 0;
    while (hts_getline(fp, KS_SEP_LINE, s) >= 0) {
        if (s->l == 0) continue;
        if (s->s[0] != '#') {
            if (hts_verbose >= 2)
                fprintf(stderr, "[E::%s] no sample line\n", __func__);
            free(txt.s);
            bcf_hdr_destroy(h);
            return 0;
        }
        if (s->s[1] != '#' && fp->fn_aux) { // insert contigs here
            int dret;
            gzFile f;
            kstream_t *ks;
            kstring_t tmp;
            tmp.l = tmp.m = 0; tmp.s = 0;
            f = gzopen(fp->fn_aux, "r");
            ks = ks_init(f);
            while (ks_getuntil(ks, 0, &tmp, &dret) >= 0) {
                int c;
                kputs("##contig=<ID=", &txt); kputs(tmp.s, &txt);
                ks_getuntil(ks, 0, &tmp, &dret);
                kputs(",length=", &txt); kputw(atol(tmp.s), &txt);
                kputsn(">\n", 2, &txt);
                if (dret != '\n')
                    while ((c = ks_getc(ks)) != '\n' && c != -1); // skip the rest of the line
            }
            free(tmp.s);
            ks_destroy(ks);
            gzclose(f);
        }
        kputsn(s->s, s->l, &txt);
        kputc('\n', &txt);
        if (s->s[1] != '#') break;
    }
    if ( !txt.s )
    {
        fprintf(stderr,"[%s:%d %s] Could not read the header\n", __FILE__,__LINE__,__FUNCTION__);
        return NULL;
    }
    bcf_hdr_parse(h, txt.s);

    // check tabix index, are all contigs listed in the header? add the missing ones
    tbx_t *idx = tbx_index_load(fp->fn);
    if ( idx )
    {
        int i, n, need_sync = 0;
        const char **names = tbx_seqnames(idx, &n);
        for (i=0; i<n; i++)
        {
            bcf_hrec_t *hrec = bcf_hdr_get_hrec(h, BCF_HL_CTG, "ID", (char*) names[i], NULL);
            if ( hrec ) continue;
            hrec = (bcf_hrec_t*) calloc(1,sizeof(bcf_hrec_t));
            hrec->key = strdup("contig");
            bcf_hrec_add_key(hrec, "ID", strlen("ID"));
            bcf_hrec_set_val(hrec, hrec->nkeys-1, (char*) names[i], strlen(names[i]), 0);
            bcf_hdr_add_hrec(h, hrec);
            need_sync = 1;
        }
        free(names);
        tbx_destroy(idx);
        if ( need_sync )
            bcf_hdr_sync(h);
    }
    free(txt.s);
    return h;
}